

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

Api RtAudio::getCompiledApiByName(string *name)

{
  bool bVar1;
  uint local_1c;
  uint i;
  string *name_local;
  
  local_1c = 0;
  while( true ) {
    if (1 < local_1c) {
      return UNSPECIFIED;
    }
    bVar1 = std::operator==(name,rtaudio_api_names[rtaudio_compiled_apis[local_1c]][0]);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return rtaudio_compiled_apis[local_1c];
}

Assistant:

RtAudio::Api RtAudio :: getCompiledApiByName( const std::string &name )
{
  unsigned int i=0;
  for (i = 0; i < rtaudio_num_compiled_apis; ++i)
    if (name == rtaudio_api_names[rtaudio_compiled_apis[i]][0])
      return rtaudio_compiled_apis[i];
  return RtAudio::UNSPECIFIED;
}